

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep_coefficients.c
# Opt level: O3

char * SplittingStepCoefficients_IDToName(ARKODE_SplittingCoefficientsID id)

{
  char *pcVar1;
  
  if ((uint)(id + ARKODE_SPLITTING_STRANG_2_2_2) < 8) {
    pcVar1 = &DAT_00181880 +
             *(int *)(&DAT_00181880 + (ulong)(uint)(id + ARKODE_SPLITTING_STRANG_2_2_2) * 4);
  }
  else {
    pcVar1 = (char *)0x0;
    arkProcessError((ARKodeMem)0x0,-0x16,0xdf,"SplittingStepCoefficients_IDToName",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_splittingstep_coefficients.c"
                    ,"Unknown splitting coefficients");
  }
  return pcVar1;
}

Assistant:

const char* SplittingStepCoefficients_IDToName(
  const ARKODE_SplittingCoefficientsID id)
{
  /* Use X-macro to test each coefficient name */
  switch (id)
  {
#define ARK_SPLITTING_COEFFICIENTS(name, coeff) \
  case name: return #name;
#include "arkode_splittingstep_coefficients.def"
#undef ARK_SPLITTING_COEFFICIENTS

  default:
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Unknown splitting coefficients");
    return NULL;
  }
}